

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CombineAccessChains::Has64BitIndices(CombineAccessChains *this,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  TypeManager *this_02;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t index;
  
  uVar2 = 1;
  do {
    index = uVar2;
    uVar1 = Instruction::NumInOperands(inst);
    if (uVar1 <= index) break;
    this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    uVar2 = Instruction::GetSingleWordInOperand(inst,index);
    this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
    this_02 = IRContext::get_type_mgr((this->super_Pass).context_);
    uVar2 = Instruction::type_id(this_01);
    pTVar4 = analysis::TypeManager::GetType(this_02,uVar2);
    iVar3 = (*pTVar4->_vptr_Type[10])(pTVar4);
    if (CONCAT44(extraout_var,iVar3) == 0) break;
    iVar3 = (*pTVar4->_vptr_Type[10])(pTVar4);
    uVar2 = index + 1;
  } while (*(int *)(CONCAT44(extraout_var_00,iVar3) + 0x24) == 0x20);
  return index < uVar1;
}

Assistant:

bool CombineAccessChains::Has64BitIndices(Instruction* inst) {
  for (uint32_t i = 1; i < inst->NumInOperands(); ++i) {
    Instruction* index_inst =
        context()->get_def_use_mgr()->GetDef(inst->GetSingleWordInOperand(i));
    const analysis::Type* index_type =
        context()->get_type_mgr()->GetType(index_inst->type_id());
    if (!index_type->AsInteger() || index_type->AsInteger()->width() != 32)
      return true;
  }
  return false;
}